

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void process_data_context_main
               (j_decompress_ptr cinfo,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  jpeg_d_main_controller *pjVar1;
  int iVar2;
  my_main_ptr main;
  JDIMENSION out_rows_avail_local;
  JDIMENSION *out_row_ctr_local;
  JSAMPARRAY output_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->main;
  if (*(int *)&pjVar1[6].start_pass == 0) {
    iVar2 = (*cinfo->coef->decompress_data)
                      (cinfo,(JSAMPIMAGE)(&pjVar1[6].process_data)[*(int *)&pjVar1[7].process_data])
    ;
    if (iVar2 == 0) {
      return;
    }
    *(undefined4 *)&pjVar1[6].start_pass = 1;
    *(int *)((long)&pjVar1[8].start_pass + 4) = *(int *)((long)&pjVar1[8].start_pass + 4) + 1;
  }
  iVar2 = *(int *)((long)&pjVar1[7].process_data + 4);
  if (iVar2 != 0) {
    if (iVar2 == 1) goto LAB_0010cae7;
    if (iVar2 != 2) {
      return;
    }
    (*cinfo->post->post_process_data)
              (cinfo,(JSAMPIMAGE)(&pjVar1[6].process_data)[*(int *)&pjVar1[7].process_data],
               (JDIMENSION *)((long)&pjVar1[6].start_pass + 4),*(JDIMENSION *)&pjVar1[8].start_pass,
               output_buf,out_row_ctr,out_rows_avail);
    if (*(uint *)((long)&pjVar1[6].start_pass + 4) < *(uint *)&pjVar1[8].start_pass) {
      return;
    }
    *(undefined4 *)((long)&pjVar1[7].process_data + 4) = 0;
    if (out_rows_avail <= *out_row_ctr) {
      return;
    }
  }
  *(undefined4 *)((long)&pjVar1[6].start_pass + 4) = 0;
  *(int *)&pjVar1[8].start_pass = cinfo->min_DCT_v_scaled_size + -1;
  if (*(JDIMENSION *)((long)&pjVar1[8].start_pass + 4) == cinfo->total_iMCU_rows) {
    set_bottom_pointers(cinfo);
  }
  *(undefined4 *)((long)&pjVar1[7].process_data + 4) = 1;
LAB_0010cae7:
  (*cinfo->post->post_process_data)
            (cinfo,(JSAMPIMAGE)(&pjVar1[6].process_data)[*(int *)&pjVar1[7].process_data],
             (JDIMENSION *)((long)&pjVar1[6].start_pass + 4),*(JDIMENSION *)&pjVar1[8].start_pass,
             output_buf,out_row_ctr,out_rows_avail);
  if (*(uint *)&pjVar1[8].start_pass <= *(uint *)((long)&pjVar1[6].start_pass + 4)) {
    if (*(int *)((long)&pjVar1[8].start_pass + 4) == 1) {
      set_wraparound_pointers(cinfo);
    }
    *(uint *)&pjVar1[7].process_data = *(uint *)&pjVar1[7].process_data ^ 1;
    *(undefined4 *)&pjVar1[6].start_pass = 0;
    *(int *)((long)&pjVar1[6].start_pass + 4) = cinfo->min_DCT_v_scaled_size + 1;
    *(int *)&pjVar1[8].start_pass = cinfo->min_DCT_v_scaled_size + 2;
    *(undefined4 *)((long)&pjVar1[7].process_data + 4) = 2;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_context_main (j_decompress_ptr cinfo,
			   JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
			   JDIMENSION out_rows_avail)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;

  /* Read input data if we haven't filled the main buffer yet */
  if (! main->buffer_full) {
    if (! (*cinfo->coef->decompress_data) (cinfo,
					   main->xbuffer[main->whichptr]))
      return;			/* suspension forced, can do nothing more */
    main->buffer_full = TRUE;	/* OK, we have an iMCU row to work with */
    main->iMCU_row_ctr++;	/* count rows received */
  }

  /* Postprocessor typically will not swallow all the input data it is handed
   * in one call (due to filling the output buffer first).  Must be prepared
   * to exit and restart.  This switch lets us keep track of how far we got.
   * Note that each case falls through to the next on successful completion.
   */
  switch (main->context_state) {
  case CTX_POSTPONED_ROW:
    /* Call postprocessor using previously set pointers for postponed row */
    (*cinfo->post->post_process_data) (cinfo, main->xbuffer[main->whichptr],
			&main->rowgroup_ctr, main->rowgroups_avail,
			output_buf, out_row_ctr, out_rows_avail);
    if (main->rowgroup_ctr < main->rowgroups_avail)
      return;			/* Need to suspend */
    main->context_state = CTX_PREPARE_FOR_IMCU;
    if (*out_row_ctr >= out_rows_avail)
      return;			/* Postprocessor exactly filled output buf */
    /*FALLTHROUGH*/
  case CTX_PREPARE_FOR_IMCU:
    /* Prepare to process first M-1 row groups of this iMCU row */
    main->rowgroup_ctr = 0;
    main->rowgroups_avail = (JDIMENSION) (cinfo->min_DCT_v_scaled_size - 1);
    /* Check for bottom of image: if so, tweak pointers to "duplicate"
     * the last sample row, and adjust rowgroups_avail to ignore padding rows.
     */
    if (main->iMCU_row_ctr == cinfo->total_iMCU_rows)
      set_bottom_pointers(cinfo);
    main->context_state = CTX_PROCESS_IMCU;
    /*FALLTHROUGH*/
  case CTX_PROCESS_IMCU:
    /* Call postprocessor using previously set pointers */
    (*cinfo->post->post_process_data) (cinfo, main->xbuffer[main->whichptr],
			&main->rowgroup_ctr, main->rowgroups_avail,
			output_buf, out_row_ctr, out_rows_avail);
    if (main->rowgroup_ctr < main->rowgroups_avail)
      return;			/* Need to suspend */
    /* After the first iMCU, change wraparound pointers to normal state */
    if (main->iMCU_row_ctr == 1)
      set_wraparound_pointers(cinfo);
    /* Prepare to load new iMCU row using other xbuffer list */
    main->whichptr ^= 1;	/* 0=>1 or 1=>0 */
    main->buffer_full = FALSE;
    /* Still need to process last row group of this iMCU row, */
    /* which is saved at index M+1 of the other xbuffer */
    main->rowgroup_ctr = (JDIMENSION) (cinfo->min_DCT_v_scaled_size + 1);
    main->rowgroups_avail = (JDIMENSION) (cinfo->min_DCT_v_scaled_size + 2);
    main->context_state = CTX_POSTPONED_ROW;
  }
}